

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_lerp(quaternion *start,quaternion *end,float percent,quaternion *qR)

{
  long lVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = -percent;
  if (-percent <= percent) {
    fVar3 = percent;
  }
  if (fVar3 < 1e-05) {
    uVar2 = *(undefined8 *)&start->field_0;
    fVar3 = (start->field_0).q[2];
    fVar4 = (start->field_0).q[3];
  }
  else {
    fVar4 = percent + -1.0;
    fVar3 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar3 = fVar4;
    }
    if (1e-05 <= fVar3) {
      fVar3 = 1.0 - percent;
      (qR->field_0).q[3] = (start->field_0).q[3] * fVar3 + (end->field_0).q[3] * percent;
      (qR->field_0).q[0] = (start->field_0).q[0] * fVar3 + (end->field_0).q[0] * percent;
      (qR->field_0).q[1] = (start->field_0).q[1] * fVar3 + (end->field_0).q[1] * percent;
      fVar4 = fVar3 * (start->field_0).q[2] + percent * (end->field_0).q[2];
      lVar1 = 8;
      goto LAB_0010cca9;
    }
    uVar2 = *(undefined8 *)&end->field_0;
    fVar3 = (end->field_0).q[2];
    fVar4 = (end->field_0).q[3];
  }
  *(undefined8 *)&qR->field_0 = uVar2;
  (qR->field_0).q[2] = fVar3;
  lVar1 = 0xc;
LAB_0010cca9:
  *(float *)((long)&qR->field_0 + lVar1) = fVar4;
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_lerp(const struct quaternion *start, const struct quaternion *end, HYP_FLOAT percent, struct quaternion *qR)
{
	HYP_FLOAT f1, f2;

	/* if percent is 0, return start */
	if (scalar_equalsf(percent, 0.0f)) {
		quaternion_set(qR, start);
		return qR;
	}

	/* if percent is 1 return end */
	if (scalar_equalsf(percent, 1.0f)) {
		quaternion_set(qR, end);
		return qR;
	}

	f1 = 1.0f - percent;
	f2 = percent;

	/* this expanded form avoids calling quaternion_multiply and
	 * quaternion_add
	 */
	qR->w = f1 * start->w + f2 * end->w;
	qR->x = f1 * start->x + f2 * end->x;
	qR->y = f1 * start->y + f2 * end->y;
	qR->z = f1 * start->z + f2 * end->z;

	return qR;
}